

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regr_r2.cpp
# Opt level: O3

void duckdb::RegrR2Operation::Finalize<double,duckdb::RegrR2State>
               (RegrR2State *state,double *target,AggregateFinalizeData *finalize_data)

{
  ulong uVar1;
  char cVar2;
  OutOfRangeException *pOVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  uVar1 = (state->var_pop_x).count;
  if (uVar1 < 2) {
    dVar4 = 0.0;
  }
  else {
    auVar6._8_4_ = (int)(uVar1 >> 0x20);
    auVar6._0_8_ = uVar1;
    auVar6._12_4_ = 0x45300000;
    dVar4 = (state->var_pop_x).dsquared /
            ((auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
  }
  cVar2 = duckdb::Value::DoubleIsFinite(dVar4);
  if (cVar2 == '\0') {
    pOVar3 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"VARPOP(X) is out of range!","");
    duckdb::OutOfRangeException::OutOfRangeException(pOVar3,(string *)local_40);
    __cxa_throw(pOVar3,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
  }
  dVar5 = 0.0;
  if ((dVar4 == 0.0) && (!NAN(dVar4))) {
    AggregateFinalizeData::ReturnNull(finalize_data);
    return;
  }
  uVar1 = (state->var_pop_y).count;
  if (1 < uVar1) {
    auVar7._8_4_ = (int)(uVar1 >> 0x20);
    auVar7._0_8_ = uVar1;
    auVar7._12_4_ = 0x45300000;
    dVar5 = (state->var_pop_y).dsquared /
            ((auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
  }
  cVar2 = duckdb::Value::DoubleIsFinite(dVar5);
  if (cVar2 != '\0') {
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      CorrOperation::Finalize<double,duckdb::CorrState>(&state->corr,target,finalize_data);
      dVar4 = *target * *target;
    }
    else {
      dVar4 = 1.0;
    }
    *target = dVar4;
    return;
  }
  pOVar3 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"VARPOP(Y) is out of range!","");
  duckdb::OutOfRangeException::OutOfRangeException(pOVar3,(string *)local_40);
  __cxa_throw(pOVar3,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		auto var_pop_x = state.var_pop_x.count > 1 ? (state.var_pop_x.dsquared / state.var_pop_x.count) : 0;
		if (!Value::DoubleIsFinite(var_pop_x)) {
			throw OutOfRangeException("VARPOP(X) is out of range!");
		}
		if (var_pop_x == 0) {
			finalize_data.ReturnNull();
			return;
		}
		auto var_pop_y = state.var_pop_y.count > 1 ? (state.var_pop_y.dsquared / state.var_pop_y.count) : 0;
		if (!Value::DoubleIsFinite(var_pop_y)) {
			throw OutOfRangeException("VARPOP(Y) is out of range!");
		}
		if (var_pop_y == 0) {
			target = 1;
			return;
		}
		CorrOperation::Finalize<T, CorrState>(state.corr, target, finalize_data);
		target = pow(target, 2);
	}